

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O0

void __thiscall piksel::Graphics::line(Graphics *this,float x1,float y1,float x2,float y2)

{
  undefined8 uVar1;
  State *pSVar2;
  float __x;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uStack_40;
  float angle;
  vec2 r;
  vec2 b;
  vec2 a;
  State *state;
  float y2_local;
  float x2_local;
  float y1_local;
  float x1_local;
  Graphics *this_local;
  
  push(this);
  pSVar2 = peek(this);
  uVar1 = *(undefined8 *)((long)&(pSVar2->shaderRelevantState).strokeColor.field_0 + 8);
  *(undefined8 *)&(pSVar2->shaderRelevantState).fillColor.field_0 =
       *(undefined8 *)&(pSVar2->shaderRelevantState).strokeColor.field_0;
  *(undefined8 *)((long)&(pSVar2->shaderRelevantState).fillColor.field_0 + 8) = uVar1;
  (pSVar2->shaderIrrelevantState).fill = (bool)((pSVar2->shaderIrrelevantState).stroke & 1);
  (pSVar2->shaderIrrelevantState).stroke = false;
  (pSVar2->shaderRelevantState).textureIndex = -1.0;
  glm::vec<2,_float,_(glm::qualifier)0>::vec(&b,x1,y1);
  glm::vec<2,_float,_(glm::qualifier)0>::vec(&r,x2,y2);
  _uStack_40 = (anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
                )glm::operator-(&r,&b);
  __x = atan2f(angle,(float)uStack_40);
  fVar3 = sinf(__x);
  fVar5 = (pSVar2->shaderRelevantState).strokeWeight;
  fVar4 = cosf(__x);
  translate(this,x1 + (fVar3 * fVar5) / 2.0,
            y1 - (fVar4 * (pSVar2->shaderRelevantState).strokeWeight) / 2.0);
  rotate(this,__x);
  rectMode(this,CORNER);
  fVar5 = glm::length<2,float,(glm::qualifier)0>
                    ((vec<2,_float,_(glm::qualifier)0> *)&stack0xffffffffffffffc0);
  rect(this,0.0,0.0,fVar5,(pSVar2->shaderRelevantState).strokeWeight);
  pop(this);
  return;
}

Assistant:

void Graphics::line(float x1, float y1, float x2, float y2) {
	push();
	State& state = peek();
	state.shaderRelevantState.fillColor = state.shaderRelevantState.strokeColor;
    state.shaderIrrelevantState.fill = state.shaderIrrelevantState.stroke;
    state.shaderIrrelevantState.stroke = false;
    state.shaderRelevantState.textureIndex = -1;
    glm::vec2 a = glm::vec2(x1, y1);
	glm::vec2 b = glm::vec2(x2, y2);
	glm::vec2 r = b - a;
	float angle = atan2f(r.y, r.x);
	translate(x1 + sinf(angle) * state.shaderRelevantState.strokeWeight / 2.0f, y1 - cosf(angle) * state.shaderRelevantState.strokeWeight / 2.0f);
	rotate(angle);
    rectMode(DrawMode::CORNER);
	rect(0.0f, 0.0f, glm::length(r), state.shaderRelevantState.strokeWeight);
    // state.shaderRelevantState.textureIndex = 0;
    // ellipseMode(DrawMode::CENTER);
    // ellipse(0.0f, state.shaderRelevantState.strokeWeight / 2.0f, state.shaderRelevantState.strokeWeight, state.shaderRelevantState.strokeWeight);
    // ellipse(glm::length(r), state.shaderRelevantState.strokeWeight / 2.0f, state.shaderRelevantState.strokeWeight, state.shaderRelevantState.strokeWeight);
	pop();
}